

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorRole fr,ColorRole br)

{
  QSharedDataPointer<QStyleSheetBackgroundData> *this_00;
  QStyleSheetBackgroundData *pQVar1;
  QStyleSheetPaletteData *pQVar2;
  QSharedDataPointer<QStyleSheetPaletteData> *this_01;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QBrush local_50 [8];
  undefined8 local_48;
  undefined4 local_40;
  undefined2 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->bg;
  pQVar1 = QSharedDataPointer::operator_cast_to_QStyleSheetBackgroundData_
                     ((QSharedDataPointer *)this_00);
  if (pQVar1 != (QStyleSheetBackgroundData *)0x0) {
    pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
    if (*(int *)(*(long *)&pQVar1->brush + 4) != 0) {
      if (br != NoRole) {
        pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
        QPalette::setBrush(p,br,&pQVar1->brush);
      }
      pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
      QPalette::setBrush(p,Window,&pQVar1->brush);
      pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
      if (*(int *)(*(long *)&pQVar1->brush + 4) == 1) {
        pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
        auVar3 = QColor::lighter((int)*(undefined8 *)&pQVar1->brush + 8);
        local_48 = auVar3._0_8_;
        local_40 = auVar3._8_4_;
        local_3c = auVar3._12_2_;
        QBrush::QBrush(local_50,(QColor *)&local_48,SolidPattern);
        QPalette::setBrush(p,Light,local_50);
        QBrush::~QBrush(local_50);
        pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
        auVar3 = QColor::lighter((int)*(undefined8 *)&pQVar1->brush + 8);
        local_48 = auVar3._0_8_;
        local_40 = auVar3._8_4_;
        local_3c = auVar3._12_2_;
        QBrush::QBrush(local_50,(QColor *)&local_48,SolidPattern);
        QPalette::setBrush(p,Midlight,local_50);
        QBrush::~QBrush(local_50);
        pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
        auVar3 = QColor::darker((int)*(undefined8 *)&pQVar1->brush + 8);
        local_48 = auVar3._0_8_;
        local_40 = auVar3._8_4_;
        local_3c = auVar3._12_2_;
        QBrush::QBrush(local_50,(QColor *)&local_48,SolidPattern);
        QPalette::setBrush(p,Dark,local_50);
        QBrush::~QBrush(local_50);
        pQVar1 = QSharedDataPointer<QStyleSheetBackgroundData>::operator->(this_00);
        auVar3 = QColor::darker((int)*(undefined8 *)&pQVar1->brush + 8);
        local_48 = auVar3._0_8_;
        local_40 = auVar3._8_4_;
        local_3c = auVar3._12_2_;
        QBrush::QBrush(local_50,(QColor *)&local_48,SolidPattern);
        QPalette::setBrush(p,Shadow,local_50);
        QBrush::~QBrush(local_50);
      }
    }
  }
  if ((this->pal).d.ptr != (QStyleSheetPaletteData *)0x0) {
    this_01 = &this->pal;
    pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar2->foreground + 4) != 0) {
      if (fr != NoRole) {
        pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
        QPalette::setBrush(p,fr,&pQVar2->foreground);
      }
      pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(p,WindowText,&pQVar2->foreground);
      pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(p,Text,&pQVar2->foreground);
    }
    pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar2->selectionBackground + 4) != 0) {
      pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(p,Highlight,&pQVar2->selectionBackground);
    }
    pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar2->selectionForeground + 4) != 0) {
      pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(p,HighlightedText,&pQVar2->selectionForeground);
    }
    pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
    if (*(int *)(*(long *)&pQVar2->alternateBackground + 4) != 0) {
      pQVar2 = QSharedDataPointer<QStyleSheetPaletteData>::operator->(this_01);
      QPalette::setBrush(p,AlternateBase,&pQVar2->alternateBackground);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorRole fr, QPalette::ColorRole br)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        if (br != QPalette::NoRole)
            p->setBrush(br, bg->brush);
        p->setBrush(QPalette::Window, bg->brush);
        if (bg->brush.style() == Qt::SolidPattern) {
            p->setBrush(QPalette::Light, bg->brush.color().lighter(115));
            p->setBrush(QPalette::Midlight, bg->brush.color().lighter(107));
            p->setBrush(QPalette::Dark, bg->brush.color().darker(150));
            p->setBrush(QPalette::Shadow, bg->brush.color().darker(300));
        }
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        if (fr != QPalette::NoRole)
            p->setBrush(fr, pal->foreground);
        p->setBrush(QPalette::WindowText, pal->foreground);
        p->setBrush(QPalette::Text, pal->foreground);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(QPalette::AlternateBase, pal->alternateBackground);
}